

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O1

TA_RetCode
TA_HT_SINE_FramePP(TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,
                  int *outNBElement)

{
  TA_RetCode TVar1;
  
  TVar1 = TA_HT_SINE(startIdx,endIdx,(params->in->data).inReal,outBegIdx,outNBElement,
                     (params->out->data).outReal,params->out[1].data.outReal);
  return TVar1;
}

Assistant:

TA_RetCode TA_HT_SINE_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_HT_SINE(
/* Generated */                 startIdx,
/* Generated */                 endIdx,
/* Generated */                 params->in[0].data.inReal, /* inReal */
/* Generated */                 outBegIdx, 
/* Generated */                 outNBElement, 
/* Generated */                 params->out[0].data.outReal, /*  outSine */
/* Generated */                 params->out[1].data.outReal /*  outLeadSine */ );
/* Generated */ }